

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_TIFFPredictor.cc
# Opt level: O0

void __thiscall
Pl_TIFFPredictor::Pl_TIFFPredictor
          (Pl_TIFFPredictor *this,char *identifier,Pipeline *next,action_e action,uint columns,
          uint samples_per_pixel,uint bits_per_sample)

{
  uint uVar1;
  logic_error *this_00;
  runtime_error *prVar2;
  ulong uVar3;
  unsigned_long_long bpr;
  uint samples_per_pixel_local;
  uint columns_local;
  action_e action_local;
  Pipeline *next_local;
  char *identifier_local;
  Pl_TIFFPredictor *this_local;
  
  Pipeline::Pipeline(&this->super_Pipeline,identifier,next);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_TIFFPredictor_0058b6c0;
  this->action = action;
  this->columns = columns;
  this->samples_per_pixel = samples_per_pixel;
  this->bits_per_sample = bits_per_sample;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->cur_row);
  std::vector<long_long,_std::allocator<long_long>_>::vector(&this->previous);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->out);
  if (next == (Pipeline *)0x0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Attempt to create Pl_TIFFPredictor with nullptr as next")
    ;
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  if (samples_per_pixel == 0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"TIFFPredictor created with invalid samples_per_pixel")
    ;
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((bits_per_sample == 0) || (0x40 < bits_per_sample)) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"TIFFPredictor created with invalid bits_per_sample");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar1 = columns * bits_per_sample * samples_per_pixel + 7 >> 3;
  uVar3 = (ulong)uVar1;
  if ((uVar3 != 0) && (uVar3 < 0xffffffff)) {
    if (((anonymous_namespace)::memory_limit != 0) &&
       ((anonymous_namespace)::memory_limit >> 1 < uVar3)) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"TIFFPredictor memory limit exceeded");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this->bytes_per_row = uVar1;
    return;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar2,"TIFFPredictor created with invalid columns value");
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Pl_TIFFPredictor::Pl_TIFFPredictor(
    char const* identifier,
    Pipeline* next,
    action_e action,
    unsigned int columns,
    unsigned int samples_per_pixel,
    unsigned int bits_per_sample) :
    Pipeline(identifier, next),
    action(action),
    columns(columns),
    samples_per_pixel(samples_per_pixel),
    bits_per_sample(bits_per_sample)
{
    if (!next) {
        throw std::logic_error("Attempt to create Pl_TIFFPredictor with nullptr as next");
    }
    if (samples_per_pixel < 1) {
        throw std::runtime_error("TIFFPredictor created with invalid samples_per_pixel");
    }
    if ((bits_per_sample < 1) || (bits_per_sample > (8 * (sizeof(unsigned long long))))) {
        throw std::runtime_error("TIFFPredictor created with invalid bits_per_sample");
    }
    unsigned long long bpr = ((columns * bits_per_sample * samples_per_pixel) + 7) / 8;
    if ((bpr == 0) || (bpr > (UINT_MAX - 1))) {
        throw std::runtime_error("TIFFPredictor created with invalid columns value");
    }
    if (memory_limit > 0 && bpr > (memory_limit / 2U)) {
        throw std::runtime_error("TIFFPredictor memory limit exceeded");
    }
    this->bytes_per_row = bpr & UINT_MAX;
}